

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall ast::BlockStmt::~BlockStmt(BlockStmt *this)

{
  pointer ppSVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppSVar4;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__BlockStmt_00124018;
  ppSVar4 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar4 != ppSVar1) {
    do {
      if (*ppSVar4 != (Stmt *)0x0) {
        (*((*ppSVar4)->super_Node)._vptr_Node[1])();
      }
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 != ppSVar1);
    ppSVar4 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppSVar4) {
      (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppSVar4;
    }
  }
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->Stmts).
                                  super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4)
    ;
  }
  (this->tok)._vptr_Token = (_func_int **)&PTR__Token_001248c8;
  pcVar2 = (this->tok).Literal._M_dataplus._M_p;
  paVar3 = &(this->tok).Literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~BlockStmt()
    {
        for(auto stmt : Stmts)
        {
            delete stmt;
            stmt = nullptr;
        }
        Stmts.clear();
    }